

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLogLin>
::operator()(ShadedRenderer<ImPlot::GetterXsYs<unsigned_short>,_ImPlot::GetterXsYs<unsigned_short>,_ImPlot::TransformerLogLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  ushort uVar8;
  int iVar9;
  GetterXsYs<unsigned_short> *pGVar10;
  TransformerLogLin *pTVar11;
  ImPlotPlot *pIVar12;
  ImDrawVert *pIVar13;
  ImDrawIdx *pIVar14;
  double dVar15;
  ImVec2 IVar16;
  ImPlotContext *pIVar17;
  ImPlotContext *pIVar18;
  bool bVar19;
  long lVar20;
  ImDrawIdx IVar21;
  uint uVar22;
  float fVar23;
  float fVar24;
  ImVec2 IVar25;
  float fVar26;
  ImVec2 IVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  
  pIVar17 = GImPlot;
  pGVar10 = this->Getter1;
  pTVar11 = this->Transformer;
  iVar9 = pGVar10->Count;
  lVar20 = (long)(((pGVar10->Offset + prim + 1) % iVar9 + iVar9) % iVar9) * (long)pGVar10->Stride;
  uVar8 = *(ushort *)((long)pGVar10->Ys + lVar20);
  dVar15 = log10((double)*(ushort *)((long)pGVar10->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar18 = GImPlot;
  pIVar12 = pIVar17->CurrentPlot;
  dVar7 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar23 = (float)((((double)(float)(dVar15 / pIVar17->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar17->Mx +
                  (double)pIVar17->PixelRange[iVar9].Min.x);
  fVar24 = (float)(((double)uVar8 - pIVar12->YAxis[iVar9].Range.Min) * pIVar17->My[iVar9] +
                  (double)pIVar17->PixelRange[iVar9].Min.y);
  pGVar10 = this->Getter2;
  pTVar11 = this->Transformer;
  iVar9 = pGVar10->Count;
  lVar20 = (long)(((prim + 1 + pGVar10->Offset) % iVar9 + iVar9) % iVar9) * (long)pGVar10->Stride;
  uVar8 = *(ushort *)((long)pGVar10->Ys + lVar20);
  dVar15 = log10((double)*(ushort *)((long)pGVar10->Xs + lVar20) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar12 = pIVar18->CurrentPlot;
  dVar7 = (pIVar12->XAxis).Range.Min;
  iVar9 = pTVar11->YAxis;
  fVar28 = (float)((((double)(float)(dVar15 / pIVar18->LogDenX) *
                     ((pIVar12->XAxis).Range.Max - dVar7) + dVar7) - dVar7) * pIVar18->Mx +
                  (double)pIVar18->PixelRange[iVar9].Min.x);
  fVar30 = (float)(((double)uVar8 - pIVar12->YAxis[iVar9].Range.Min) * pIVar18->My[iVar9] +
                  (double)pIVar18->PixelRange[iVar9].Min.y);
  fVar2 = (this->P11).x;
  fVar3 = (this->P11).y;
  fVar4 = (this->P12).x;
  fVar5 = (this->P12).y;
  fVar26 = fVar3;
  if (fVar5 <= fVar3) {
    fVar26 = fVar5;
  }
  if (fVar24 <= fVar26) {
    fVar26 = fVar24;
  }
  if (fVar30 <= fVar26) {
    fVar26 = fVar30;
  }
  bVar19 = false;
  if ((fVar26 < (cull_rect->Max).y) &&
     (fVar26 = (float)(~-(uint)(fVar5 <= fVar3) & (uint)fVar5 |
                      -(uint)(fVar5 <= fVar3) & (uint)fVar3), uVar22 = -(uint)(fVar24 <= fVar26),
     fVar26 = (float)(~uVar22 & (uint)fVar24 | uVar22 & (uint)fVar26),
     uVar22 = -(uint)(fVar30 <= fVar26),
     fVar26 = (float)(~uVar22 & (uint)fVar30 | uVar22 & (uint)fVar26), pfVar1 = &(cull_rect->Min).y,
     *pfVar1 <= fVar26 && fVar26 != *pfVar1)) {
    fVar26 = fVar2;
    if (fVar4 <= fVar2) {
      fVar26 = fVar4;
    }
    if (fVar23 <= fVar26) {
      fVar26 = fVar23;
    }
    if (fVar28 <= fVar26) {
      fVar26 = fVar28;
    }
    bVar19 = false;
    if (fVar26 < (cull_rect->Max).x) {
      fVar26 = (float)(~-(uint)(fVar4 <= fVar2) & (uint)fVar4 |
                      -(uint)(fVar4 <= fVar2) & (uint)fVar2);
      uVar22 = -(uint)(fVar23 <= fVar26);
      fVar26 = (float)(~uVar22 & (uint)fVar23 | uVar22 & (uint)fVar26);
      uVar22 = -(uint)(fVar28 <= fVar26);
      fVar26 = (float)(~uVar22 & (uint)fVar28 | uVar22 & (uint)fVar26);
      bVar19 = (cull_rect->Min).x <= fVar26 && fVar26 != (cull_rect->Min).x;
    }
  }
  IVar25.y = fVar24;
  IVar25.x = fVar23;
  IVar27.y = fVar30;
  IVar27.x = fVar28;
  if (bVar19 != false) {
    fVar26 = (this->P11).y;
    fVar6 = (this->P12).y;
    fVar32 = fVar2 * fVar24 - fVar23 * fVar3;
    fVar31 = fVar4 * fVar30 - fVar28 * fVar5;
    fVar29 = (fVar2 - fVar23) * (fVar5 - fVar30) - (fVar4 - fVar28) * (fVar3 - fVar24);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13->col = this->Col;
    pIVar13[1].pos = IVar25;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[1].col = this->Col;
    IVar16.y = ((fVar5 - fVar30) * fVar32 - (fVar3 - fVar24) * fVar31) / fVar29;
    IVar16.x = (fVar32 * (fVar4 - fVar28) - (fVar2 - fVar23) * fVar31) / fVar29;
    pIVar13[2].pos = IVar16;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[2].col = this->Col;
    pIVar13[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[3].col = this->Col;
    pIVar13[4].pos = IVar27;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar13 = DrawList->_VtxWritePtr;
    pIVar13[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar13 + 5;
    uVar22 = DrawList->_VtxCurrentIdx;
    pIVar14 = DrawList->_IdxWritePtr;
    IVar21 = (ImDrawIdx)uVar22;
    *pIVar14 = IVar21;
    uVar8 = -(ushort)(fVar6 < fVar26 && fVar24 < fVar30 || fVar26 < fVar6 && fVar30 < fVar24) & 1;
    pIVar14[1] = IVar21 + uVar8 + 1;
    pIVar14[2] = IVar21 + 3;
    pIVar14[3] = IVar21 + 1;
    pIVar14[4] = (uVar8 ^ 3) + IVar21;
    pIVar14[5] = IVar21 + 4;
    DrawList->_IdxWritePtr = pIVar14 + 6;
    DrawList->_VtxCurrentIdx = uVar22 + 5;
  }
  this->P11 = IVar25;
  this->P12 = IVar27;
  return bVar19;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }